

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O1

void __thiscall TestMustache::testConformance(TestMustache *this)

{
  QArrayData *pQVar1;
  storage_type_conflict *psVar2;
  qsizetype qVar3;
  __atomic_base<int> _Var4;
  undefined8 *puVar5;
  long *plVar6;
  QStringView QVar7;
  QStringView QVar8;
  PartialsHash partials;
  QVariantMap data;
  QString output;
  QString template_;
  PartialMap partialsMap;
  QtVariantContext context;
  Renderer renderer;
  
  puVar5 = (undefined8 *)QTest::qData("data",8);
  data.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
              )*puVar5;
  if (data.d.d !=
      (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
       *)0x0) {
    LOCK();
    *(int *)data.d.d = *(int *)data.d.d + 1;
    UNLOCK();
  }
  plVar6 = (long *)QTest::qData("template_",10);
  template_.d.d = (Data *)*plVar6;
  template_.d.ptr = (char16_t *)plVar6[1];
  template_.d.size = plVar6[2];
  if (template_.d.d != (Data *)0x0) {
    LOCK();
    ((template_.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((template_.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  renderer.m_partialStack.super_QList<QString>.d.d =
       (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<QHash<QString,_QString>_>::metaType;
  _Var4._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QHash<QString,_QString>_>::metaType.typeId.
               _q_value.super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QHash<QString,_QString>_>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var4._M_i = QMetaType::idHelper();
  }
  plVar6 = (long *)QTest::qData("partials",_Var4._M_i);
  partials.d = (Data *)*plVar6;
  if ((partials.d != (Data *)0x0) &&
     (((partials.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((partials.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((partials.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  puVar5 = (undefined8 *)QTest::qData("expected",10);
  pQVar1 = (QArrayData *)*puVar5;
  psVar2 = (storage_type_conflict *)puVar5[1];
  qVar3 = puVar5[2];
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  Mustache::Renderer::Renderer(&renderer);
  Mustache::PartialMap::PartialMap(&partialsMap,&partials);
  ::QVariant::QVariant((QVariant *)&output,(QMap *)&data);
  Mustache::QtVariantContext::QtVariantContext
            (&context,(QVariant *)&output,&partialsMap.super_PartialResolver);
  ::QVariant::~QVariant((QVariant *)&output);
  Mustache::Renderer::render(&output,&renderer,&template_,&context.super_Context);
  QVar7.m_data = output.d.ptr;
  QVar7.m_size = output.d.size;
  QVar8.m_data = psVar2;
  QVar8.m_size = qVar3;
  QTest::qCompare(QVar7,QVar8,"output","expected",
                  "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                  ,0x212);
  if (output.d.d != (Data *)0x0) {
    LOCK();
    ((output.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((output.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((output.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(output.d.d)->super_QArrayData,2,8);
    }
  }
  context.super_Context._vptr_Context = (_func_int **)&PTR__QtVariantContext_00122c90;
  QArrayDataPointer<QVariant>::~QArrayDataPointer
            ((QArrayDataPointer<QVariant> *)&context.m_contextStack);
  partialsMap.super_PartialResolver._vptr_PartialResolver = (_func_int **)&PTR__PartialMap_00122ce8;
  QHash<QString,_QString>::~QHash(&partialsMap.m_partials);
  Mustache::Renderer::~Renderer(&renderer);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  QHash<QString,_QString>::~QHash(&partials);
  if (template_.d.d != (Data *)0x0) {
    LOCK();
    ((template_.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((template_.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((template_.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(template_.d.d)->super_QArrayData,2,8);
    }
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&data.d);
  return;
}

Assistant:

void TestMustache::testConformance()
{
	QFETCH(QVariantMap, data);
	QFETCH(QString, template_);
	QFETCH(PartialsHash, partials);
	QFETCH(QString, expected);

	Mustache::Renderer renderer;
	Mustache::PartialMap partialsMap(partials);
	Mustache::QtVariantContext context(data, &partialsMap);

	QString output = renderer.render(template_, &context);

	QCOMPARE(output, expected);
}